

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  string *psVar1;
  __type_conflict _Var2;
  string local_name;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  psVar1 = &this->name_;
  ::std::__cxx11::string::string((string *)&local_c0,(string *)psVar1);
  if (this->ignore_underscore_ == true) {
    ::std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
    detail::remove_underscore(&local_e0,&local_40);
    ::std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::string((string *)&local_60,(string *)name_to_check);
    detail::remove_underscore(&local_e0,&local_60);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  if (this->ignore_case_ == true) {
    ::std::__cxx11::string::string((string *)&local_80,(string *)psVar1);
    detail::to_lower(&local_e0,&local_80);
    ::std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::string((string *)&local_a0,(string *)name_to_check);
    detail::to_lower(&local_e0,&local_a0);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  _Var2 = ::std::operator==(&local_c0,name_to_check);
  ::std::__cxx11::string::~string((string *)&local_c0);
  return _Var2;
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_underscore_) {
            local_name = detail::remove_underscore(name_);
            name_to_check = detail::remove_underscore(name_to_check);
        }
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        return local_name == name_to_check;
    }